

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O0

int __thiscall despot::option::Option::init(Option *this,EVP_PKEY_CTX *ctx)

{
  Option *pOVar1;
  ulong uVar2;
  char *in_RCX;
  char *in_RDX;
  bool local_31;
  char *arg__local;
  char *name__local;
  Descriptor *desc__local;
  Option *this_local;
  
  this->desc = (Descriptor *)ctx;
  this->name = in_RDX;
  this->arg = in_RCX;
  pOVar1 = tag(this);
  this->prev_ = pOVar1;
  pOVar1 = tag(this);
  this->next_ = pOVar1;
  this->namelen = 0;
  pOVar1 = this;
  if (this->name != (char *)0x0) {
    this->namelen = 1;
    pOVar1 = (Option *)(ulong)(uint)(int)*this->name;
    if ((int)*this->name == 0x2d) {
      while( true ) {
        uVar2 = 0;
        local_31 = false;
        if (this->name[this->namelen] != '\0') {
          local_31 = this->name[this->namelen] != '=';
          uVar2 = (ulong)CONCAT31(this->name[this->namelen] >> 7,local_31);
        }
        pOVar1 = (Option *)CONCAT71((int7)(uVar2 >> 8),local_31);
        if (local_31 == false) break;
        this->namelen = this->namelen + 1;
      }
    }
  }
  return (int)pOVar1;
}

Assistant:

void init(const Descriptor* desc_, const char* name_, const char* arg_) {
		desc = desc_;
		name = name_;
		arg = arg_;
		prev_ = tag(this);
		next_ = tag(this);
		namelen = 0;
		if (name == 0)
			return;
		namelen = 1;
		if (name[0] != '-')
			return;
		while (name[namelen] != 0 && name[namelen] != '=')
			++namelen;
	}